

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multithreading.c
# Opt level: O0

void * sample_scene_slave(void *data)

{
  ImageBuffer *buffer;
  Ray r_00;
  float dy_00;
  float dx_00;
  int x_00;
  int y_00;
  Color c;
  undefined1 auStack_50 [8];
  Ray r;
  float sy;
  float sx;
  float dy;
  float dx;
  Sampler *sampler;
  int x;
  int y;
  SceneSampleInfo *ss;
  void *data_local;
  
  _x = (int *)data;
  ss = (SceneSampleInfo *)data;
  for (sampler._4_4_ = *(int *)((long)data + 8); sampler._4_4_ < _x[3];
      sampler._4_4_ = sampler._4_4_ + 1) {
    for (sampler._0_4_ = *_x; (int)sampler < _x[1]; sampler._0_4_ = (int)sampler + 1) {
      _dy = (Sampler *)
            (*(long *)(_x + 0x22) + (long)(sampler._4_4_ * **(int **)(_x + 4) + (int)sampler) * 0x68
            );
      _dy->current_depth = 0;
      sample_unit_square(_dy,&sx,&sy,(float *)0x0);
      r.d.z = ((float)(int)sampler + sx) / (float)**(int **)(_x + 4);
      r.d.y = 1.0 - ((float)sampler._4_4_ + sy) / (float)*(int *)(*(long *)(_x + 4) + 4);
      camera_ray((Ray *)auStack_50,*(Camera *)(_x + 0x12),r.d.z,r.d.y);
      pthread_mutex_lock((pthread_mutex_t *)(_x + 6));
      y_00 = sampler._4_4_;
      x_00 = (int)sampler;
      dx_00 = sx;
      dy_00 = sy;
      buffer = *(ImageBuffer **)(_x + 4);
      r_00.o.z = r.o.x;
      r_00.d.x = r.o.y;
      r_00.o.x = (float)auStack_50._0_4_;
      r_00.o.y = (float)auStack_50._4_4_;
      r_00.d.y = r.o.z;
      r_00.d.z = r.d.x;
      c = trace_ray(*(Scene **)(_x + 0x10),r_00,0,_dy);
      add_pixel_sample(buffer,x_00,y_00,dx_00,dy_00,c);
      pthread_mutex_unlock((pthread_mutex_t *)(_x + 6));
    }
  }
  return (void *)0x0;
}

Assistant:

void* sample_scene_slave(void* data) {
    SceneSampleInfo* ss = (SceneSampleInfo*) data;

    for (int y = ss->ymin; y < ss->ymax; y++) {
        for (int x = ss->xmin; x < ss->xmax; x++) {
            Sampler* sampler = &ss->samplers[y * ss->buffer->width + x];
            sampler->current_depth = 0;
            float dx, dy;
            sample_unit_square(sampler, &dx, &dy, NULL);
            float sx = (x + dx) / ss->buffer->width;
            float sy = 1.0f - (y + dy) / ss->buffer->height;
            Ray r = camera_ray(ss->camera, sx, sy);

            pthread_mutex_lock(&ss->buffer_mutex);
            add_pixel_sample(ss->buffer, x, y, dx, dy,
                             trace_ray(ss->scene, r, 0, sampler));
            pthread_mutex_unlock(&ss->buffer_mutex);
        }
    }

    return NULL;
}